

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

double Js::JavascriptConversion::ToInteger(double val)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  undefined1 auVar4 [16];
  double val_local;
  
  BVar2 = JavascriptNumber::IsNan(val);
  if ((BVar2 != 0) || (bVar1 = JavascriptNumber::IsZero(val), bVar1)) {
    val_local = 0.0;
  }
  else {
    bVar1 = JavascriptNumber::IsPosInf(val);
    val_local = val;
    if ((!bVar1) && (bVar1 = JavascriptNumber::IsNegInf(val), !bVar1)) {
      iVar3 = 1;
      if (val < 0.0) {
        iVar3 = -1;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = val;
      auVar4 = roundsd(auVar4 & _DAT_017e36f0,auVar4 & _DAT_017e36f0,9);
      val_local = (double)iVar3 * auVar4._0_8_;
    }
  }
  return val_local;
}

Assistant:

double JavascriptConversion::ToInteger(double val)
    {
        if(JavascriptNumber::IsNan(val) || JavascriptNumber::IsZero(val))
            return 0;
        if(JavascriptNumber::IsPosInf(val) || JavascriptNumber::IsNegInf(val))
        {
            return val;
        }

        return ( ((val < 0) ? -1 : 1 ) * floor(fabs(val)));
    }